

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

int tcu::measurePixelDiffAccuracy
              (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference,
              ConstPixelBufferAccess *result,int bestScoreDiff,int worstScoreDiff,
              CompareLogMode logMode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  InternalError *this;
  ConstPixelBufferAccess *pCVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int iVar5;
  long value;
  int iVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  IVec4 a;
  IVec4 b;
  TextureLevel diffMask;
  int local_3d0;
  allocator<char> local_3c2;
  allocator<char> local_3c1;
  ConstPixelBufferAccess *local_3c0;
  int local_3b4;
  string local_3b0;
  string local_390;
  undefined1 local_370 [40];
  string local_348;
  Vec4 local_328;
  Vec4 local_318;
  char *local_308;
  char *local_300;
  TestLog *local_2f8;
  ConstPixelBufferAccess *local_2f0;
  LogImageSet local_2e8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [96];
  qpKeyValueTag local_1a8;
  deInt64 local_1a0;
  undefined1 local_178 [96];
  qpKeyValueTag local_118;
  deInt64 local_110;
  LogImage local_e8;
  TextureLevel local_58;
  
  local_178._0_4_ = RGB;
  local_178._4_4_ = UNORM_INT8;
  local_3b4 = bestScoreDiff;
  local_300 = imageSetName;
  TextureLevel::TextureLevel
            (&local_58,(TextureFormat *)local_178,(reference->m_size).m_data[0],
             (reference->m_size).m_data[1],1);
  TextureLevel::getAccess((PixelBufferAccess *)local_178,&local_58);
  if (((reference->m_format).type != UNORM_INT8) || ((result->m_format).type != UNORM_INT8)) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this,(char *)0x0,
               "ref.getFormat().type == TextureFormat::UNORM_INT8 && cmp.getFormat().type == TextureFormat::UNORM_INT8"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x125);
    __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
  }
  iVar5 = (result->m_size).m_data[1];
  local_3c0 = result;
  local_308 = imageSetDesc;
  local_2f8 = log;
  if (iVar5 < 1) {
    value = 0;
  }
  else {
    iVar3 = (result->m_size).m_data[0];
    value = 0;
    local_3d0 = 0;
    local_2f0 = reference;
    do {
      if (0 < iVar3) {
        iVar5 = 0;
        do {
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_208,(int)local_2f0,iVar5,local_3d0);
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&local_e8,(int)local_3c0,iVar5,local_3d0);
          uVar11 = local_208._0_4_ - (int)local_e8.m_name._M_dataplus._M_p >> 0x1f;
          uVar12 = local_208._4_4_ - local_e8.m_name._M_dataplus._M_p._4_4_ >> 0x1f;
          uVar13 = local_208._8_4_ - (int)local_e8.m_name._M_string_length >> 0x1f;
          uVar14 = local_208._12_4_ - local_e8.m_name._M_string_length._4_4_ >> 0x1f;
          iVar6 = (local_208._0_4_ - (int)local_e8.m_name._M_dataplus._M_p ^ uVar11) - uVar11;
          iVar8 = (local_208._4_4_ - local_e8.m_name._M_dataplus._M_p._4_4_ ^ uVar12) - uVar12;
          iVar9 = (local_208._8_4_ - (int)local_e8.m_name._M_string_length ^ uVar13) - uVar13;
          iVar10 = (local_208._12_4_ - local_e8.m_name._M_string_length._4_4_ ^ uVar14) - uVar14;
          uVar11 = (iVar9 + iVar10 + iVar8 + iVar6) * 8;
          iVar3 = uVar11 - 0xff;
          if (0xfe < (int)uVar11) {
            uVar11 = 0xff;
          }
          iVar3 = -iVar3;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (0xfe < iVar3) {
            iVar3 = 0xff;
          }
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          local_370._0_8_ = CONCAT44(local_370._4_4_,iVar3 << 8 | uVar11) | 0xff000000;
          RGBA::toVec((RGBA *)local_370);
          PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_178,(Vec4 *)&local_2e8,iVar5,local_3d0,0);
          value = value + (iVar10 * iVar10 + iVar9 * iVar9 + iVar8 * iVar8 + iVar6 * iVar6);
          iVar5 = iVar5 + 1;
          iVar3 = (local_3c0->m_size).m_data[0];
        } while (iVar5 < iVar3);
        iVar5 = (local_3c0->m_size).m_data[1];
        reference = local_2f0;
        log = local_2f8;
      }
      local_3d0 = local_3d0 + 1;
    } while (local_3d0 < iVar5);
  }
  fVar7 = (float)value;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = floorf(100.0 - ((float)(-(uint)(0.0 <= fVar7 - (float)local_3b4) &
                                 (uint)(fVar7 - (float)local_3b4)) /
                         (float)(worstScoreDiff - local_3b4)) * 100.0);
  pCVar4 = local_3c0;
  uVar12 = (uint)fVar7;
  uVar11 = 100;
  if ((int)uVar12 < 100) {
    uVar11 = uVar12;
  }
  uVar13 = 0;
  if (0 < (int)uVar11) {
    uVar13 = uVar11;
  }
  local_318.m_data = (float  [4])ZEXT416(0);
  local_328.m_data[0] = 1.0;
  local_328.m_data[1] = 1.0;
  local_328.m_data[2] = 1.0;
  local_328.m_data[3] = 1.0;
  iVar5 = (int)log;
  if ((logMode == COMPARE_LOG_EVERYTHING) || ((int)uVar12 < 0xb)) {
    if ((((local_3c0->m_format).order != RGBA) || ((local_3c0->m_format).type != UNORM_INT8)) &&
       (((reference->m_format).order != RGBA || ((reference->m_format).type != UNORM_INT8)))) {
      anon_unknown_50::computeScaleAndBias(reference,local_3c0,&local_328,&local_318);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,local_300,&local_3c1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,local_308,&local_3c2);
    LogImageSet::LogImageSet(&local_2e8,&local_3b0,&local_348);
    TestLog::startImageSet
              (log,local_2e8.m_name._M_dataplus._M_p,local_2e8.m_description._M_dataplus._M_p);
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"Result","");
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Result","");
    LogImage::LogImage((LogImage *)local_178,&local_390,&local_268,pCVar4,&local_328,&local_318,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_178,iVar5,__buf_00,(size_t)pCVar4);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Reference","");
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Reference","");
    LogImage::LogImage((LogImage *)local_208,&local_288,&local_2a8,reference,&local_328,&local_318,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_208,iVar5,__buf_01,(size_t)reference);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"DiffMask","");
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Difference","");
    ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_370,&local_58);
    pCVar4 = (ConstPixelBufferAccess *)local_370;
    LogImage::LogImage(&local_e8,&local_228,&local_248,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_e8,iVar5,__buf_02,(size_t)pCVar4);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_description._M_dataplus._M_p != &local_e8.m_description.field_2) {
      operator_delete(local_e8.m_description._M_dataplus._M_p,
                      local_e8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_name._M_dataplus._M_p != &local_e8.m_name.field_2) {
      operator_delete(local_e8.m_name._M_dataplus._M_p,
                      local_e8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_208._32_8_ != local_208 + 0x30) {
      operator_delete((void *)local_208._32_8_,local_208._48_8_ + 1);
    }
    if ((undefined1 *)CONCAT44(local_208._4_4_,local_208._0_4_) != local_208 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_208._4_4_,local_208._0_4_),local_208._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_178._32_8_ != local_178 + 0x30) {
      operator_delete((void *)local_178._32_8_,local_178._48_8_ + 1);
    }
    if (local_178._0_8_ != (long)local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_description._M_dataplus._M_p != &local_2e8.m_description.field_2) {
      operator_delete(local_2e8.m_description._M_dataplus._M_p,
                      local_2e8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_name._M_dataplus._M_p != &local_2e8.m_name.field_2) {
      operator_delete(local_2e8.m_name._M_dataplus._M_p,
                      local_2e8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
LAB_00a22fa2:
    if ((logMode == COMPARE_LOG_ON_ERROR) && (10 < (int)uVar12)) goto LAB_00a2329e;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_00a22fa2;
    if (((local_3c0->m_format).order != RGBA) || ((local_3c0->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(local_3c0,&local_328,&local_318);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,local_300,(allocator<char> *)&local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,local_308,(allocator<char> *)&local_390);
    LogImageSet::LogImageSet((LogImageSet *)local_208,&local_e8.m_name,&local_2e8.m_name);
    TestLog::startImageSet
              (log,(char *)CONCAT44(local_208._4_4_,local_208._0_4_),(char *)local_208._32_8_);
    local_370._0_8_ = (long)local_370 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"Result","");
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"Result","");
    pCVar4 = local_3c0;
    LogImage::LogImage((LogImage *)local_178,(string *)local_370,&local_3b0,local_3c0,&local_328,
                       &local_318,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_178,iVar5,__buf,(size_t)pCVar4);
    TestLog::endImageSet(log);
    if ((undefined1 *)local_178._32_8_ != local_178 + 0x30) {
      operator_delete((void *)local_178._32_8_,local_178._48_8_ + 1);
    }
    if (local_178._0_8_ != (long)local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (local_370._0_8_ != (long)local_370 + 0x10) {
      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
    }
    if ((undefined1 *)local_208._32_8_ != local_208 + 0x30) {
      operator_delete((void *)local_208._32_8_,local_208._48_8_ + 1);
    }
    if ((undefined1 *)CONCAT44(local_208._4_4_,local_208._0_4_) != local_208 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_208._4_4_,local_208._0_4_),local_208._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8.m_name._M_dataplus._M_p != &local_2e8.m_name.field_2) {
      operator_delete(local_2e8.m_name._M_dataplus._M_p,
                      local_2e8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_name._M_dataplus._M_p != &local_e8.m_name.field_2) {
      operator_delete(local_e8.m_name._M_dataplus._M_p,
                      local_e8.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_e8.m_name.field_2;
  local_e8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"DiffSum","");
  paVar2 = &local_2e8.m_name.field_2;
  local_2e8.m_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Squared difference sum","");
  local_370._0_8_ = (long)local_370 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"");
  LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_178,&local_e8.m_name,&local_2e8.m_name,(string *)local_370,
             QP_KEY_TAG_NONE,value);
  TestLog::writeInteger
            (log,(char *)local_178._0_8_,(char *)local_178._32_8_,(char *)local_178._64_8_,local_118
             ,local_110);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"Score","");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Score","");
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"");
  LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_208,&local_3b0,&local_348,&local_390,QP_KEY_TAG_QUALITY,
             (ulong)uVar13);
  TestLog::writeInteger
            (local_2f8,(char *)CONCAT44(local_208._4_4_,local_208._0_4_),(char *)local_208._32_8_,
             (char *)local_208._64_8_,local_1a8,local_1a0);
  if (local_208._64_8_ != (long)local_208 + 0x50) {
    operator_delete((void *)local_208._64_8_,local_208._80_8_ + 1);
  }
  if ((undefined1 *)local_208._32_8_ != local_208 + 0x30) {
    operator_delete((void *)local_208._32_8_,local_208._48_8_ + 1);
  }
  if ((undefined1 *)CONCAT44(local_208._4_4_,local_208._0_4_) != local_208 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_208._4_4_,local_208._0_4_),local_208._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if (local_178._64_8_ != (long)local_178 + 0x50) {
    operator_delete((void *)local_178._64_8_,local_178._80_8_ + 1);
  }
  if ((undefined1 *)local_178._32_8_ != local_178 + 0x30) {
    operator_delete((void *)local_178._32_8_,local_178._48_8_ + 1);
  }
  if (local_178._0_8_ != (long)local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if (local_370._0_8_ != (long)local_370 + 0x10) {
    operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_2e8.m_name._M_dataplus._M_p,
                    local_2e8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.m_name._M_dataplus._M_p,
                    local_e8.m_name.field_2._M_allocated_capacity + 1);
  }
LAB_00a2329e:
  TextureLevel::~TextureLevel(&local_58);
  return uVar13;
}

Assistant:

int measurePixelDiffAccuracy (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, int bestScoreDiff, int worstScoreDiff, CompareLogMode logMode)
{
	TextureLevel	diffMask		(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), reference.getWidth(), reference.getHeight());
	int				diffFactor		= 8;
	deInt64			squaredSum		= computeSquaredDiffSum(reference, result, diffMask.getAccess(), diffFactor);
	float			sum				= deFloatSqrt((float)squaredSum);
	int				score			= deClamp32(deFloorFloatToInt32(100.0f - (de::max(sum-(float)bestScoreDiff, 0.0f) / (float)(worstScoreDiff-bestScoreDiff))*100.0f), 0, 100);
	const int		failThreshold	= 10;
	Vec4			pixelBias		(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4			pixelScale		(1.0f, 1.0f, 1.0f, 1.0f);

	if (logMode == COMPARE_LOG_EVERYTHING || score <= failThreshold)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8) && reference.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computeScaleAndBias(reference, result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",			result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",		reference,	pixelScale, pixelBias)
			<< TestLog::Image("DiffMask",	"Difference",		diffMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",			result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	if (logMode != COMPARE_LOG_ON_ERROR || score <= failThreshold)
		log << TestLog::Integer("DiffSum", "Squared difference sum", "", QP_KEY_TAG_NONE, squaredSum)
			<< TestLog::Integer("Score", "Score", "", QP_KEY_TAG_QUALITY, score);

	return score;
}